

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineImageUtil.cpp
# Opt level: O0

void __thiscall
vkt::pipeline::TestTexture::populateCompressedLevels
          (TestTexture *this,CompressedTexFormat format,
          vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
          *decompressedLevels)

{
  deUint8 *pdVar1;
  void *pvVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int depth;
  deUint32 dVar6;
  void *pvVar7;
  const_reference pvVar8;
  CompressedTexture *this_00;
  TexDecompressionParams local_88;
  int local_84;
  deUint8 *pdStack_80;
  int byteNdx;
  deUint8 *compressedData;
  CompressedTexture *compressedLevel;
  undefined1 local_60 [8];
  PixelBufferAccess level;
  size_t levelNdx;
  Random random;
  vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_> *decompressedLevels_local;
  CompressedTexFormat format_local;
  TestTexture *this_local;
  
  random.m_rnd._8_8_ = decompressedLevels;
  de::Random::Random((Random *)&levelNdx,0x7b);
  for (level.super_ConstPixelBufferAccess.m_data = (void *)0x0;
      pvVar2 = level.super_ConstPixelBufferAccess.m_data,
      pvVar7 = (void *)std::vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                       ::size((vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                               *)random.m_rnd._8_8_), pvVar2 < pvVar7;
      level.super_ConstPixelBufferAccess.m_data =
           (void *)((long)level.super_ConstPixelBufferAccess.m_data + 1)) {
    pvVar8 = std::vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>::
             operator[]((vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_> *)
                        random.m_rnd._8_8_,(size_type)level.super_ConstPixelBufferAccess.m_data);
    tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)local_60,pvVar8);
    this_00 = (CompressedTexture *)operator_new(0x28);
    iVar4 = tcu::ConstPixelBufferAccess::getWidth((ConstPixelBufferAccess *)local_60);
    iVar5 = tcu::ConstPixelBufferAccess::getHeight((ConstPixelBufferAccess *)local_60);
    depth = tcu::ConstPixelBufferAccess::getDepth((ConstPixelBufferAccess *)local_60);
    tcu::CompressedTexture::CompressedTexture(this_00,format,iVar4,iVar5,depth);
    compressedData = (deUint8 *)this_00;
    pdStack_80 = (deUint8 *)tcu::CompressedTexture::getData(this_00);
    bVar3 = tcu::isAstcFormat(format);
    pdVar1 = pdStack_80;
    if (bVar3) {
      iVar4 = tcu::CompressedTexture::getDataSize((CompressedTexture *)compressedData);
      if (iVar4 < 0) {
        iVar4 = iVar4 + 0xf;
      }
      dVar6 = de::Random::getUint32((Random *)&levelNdx);
      tcu::astc::generateRandomValidBlocks(pdVar1,(long)(iVar4 >> 4),format,ASTCMODE_LDR,dVar6);
    }
    else if (format != COMPRESSEDTEXFORMAT_ETC1_RGB8) {
      for (local_84 = 0; iVar4 = local_84,
          iVar5 = tcu::CompressedTexture::getDataSize((CompressedTexture *)compressedData),
          iVar4 < iVar5; local_84 = local_84 + 1) {
        dVar6 = de::Random::getUint32((Random *)&levelNdx);
        pdStack_80[local_84] = (deUint8)dVar6;
      }
    }
    std::vector<tcu::CompressedTexture_*,_std::allocator<tcu::CompressedTexture_*>_>::push_back
              (&this->m_compressedLevels,(value_type *)&compressedData);
    pdVar1 = compressedData;
    tcu::TexDecompressionParams::TexDecompressionParams(&local_88,ASTCMODE_LDR);
    tcu::CompressedTexture::decompress
              ((CompressedTexture *)pdVar1,(PixelBufferAccess *)local_60,&local_88);
  }
  de::Random::~Random((Random *)&levelNdx);
  return;
}

Assistant:

void TestTexture::populateCompressedLevels (tcu::CompressedTexFormat format, const std::vector<tcu::PixelBufferAccess>& decompressedLevels)
{
	// Generate random compressed data and update decompressed data

	de::Random random(123);

	for (size_t levelNdx = 0; levelNdx < decompressedLevels.size(); levelNdx++)
	{
		const tcu::PixelBufferAccess	level				= decompressedLevels[levelNdx];
		tcu::CompressedTexture*			compressedLevel		= new tcu::CompressedTexture(format, level.getWidth(), level.getHeight(), level.getDepth());
		deUint8* const					compressedData		= (deUint8*)compressedLevel->getData();

		if (tcu::isAstcFormat(format))
		{
			// \todo [2016-01-20 pyry] Comparison doesn't currently handle invalid blocks correctly so we use only valid blocks
			tcu::astc::generateRandomValidBlocks(compressedData, compressedLevel->getDataSize()/tcu::astc::BLOCK_SIZE_BYTES,
												 format, tcu::TexDecompressionParams::ASTCMODE_LDR, random.getUint32());
		}
		else
		{
			// Generate random compressed data
			// Random initial values cause assertion during the decompression in case of COMPRESSEDTEXFORMAT_ETC1_RGB8 format
			if (format != tcu::COMPRESSEDTEXFORMAT_ETC1_RGB8)
				for (int byteNdx = 0; byteNdx < compressedLevel->getDataSize(); byteNdx++)
					compressedData[byteNdx] = 0xFF & random.getUint32();
		}

		m_compressedLevels.push_back(compressedLevel);

		// Store decompressed data
		compressedLevel->decompress(level, tcu::TexDecompressionParams(tcu::TexDecompressionParams::ASTCMODE_LDR));
	}
}